

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pooling.c
# Opt level: O2

float calc_max_generic(pooling_calc_context_t calc)

{
  int iVar1;
  int iVar2;
  int kx;
  int iVar3;
  int iVar4;
  int jx;
  int iVar5;
  float fVar6;
  int in_stack_00000008;
  int in_stack_0000000c;
  int in_stack_00000010;
  int in_stack_00000014;
  int in_stack_00000018;
  int in_stack_0000001c;
  int in_stack_00000020;
  int in_stack_00000024;
  int in_stack_0000002c;
  undefined8 in_stack_00000030;
  code *in_stack_00000038;
  int in_stack_00000050;
  undefined4 local_60;
  
  if (in_stack_0000002c == 3) {
    iVar4 = in_stack_00000010 * in_stack_00000024 +
            in_stack_00000020 * in_stack_00000008 + in_stack_00000050 + in_stack_00000018;
    local_60 = -3.4028235e+38;
    for (; iVar1 = iVar4, iVar5 = in_stack_00000010, in_stack_00000008 < in_stack_0000000c;
        in_stack_00000008 = in_stack_00000008 + 1) {
      for (; iVar2 = iVar1, iVar3 = in_stack_00000018, iVar5 < in_stack_00000014; iVar5 = iVar5 + 1)
      {
        for (; iVar3 < in_stack_0000001c; iVar3 = iVar3 + 1) {
          fVar6 = (float)(*in_stack_00000038)(in_stack_00000030,iVar2);
          if (fVar6 <= local_60) {
            fVar6 = local_60;
          }
          iVar2 = iVar2 + 1;
          local_60 = fVar6;
        }
        iVar1 = iVar1 + in_stack_00000024;
      }
      iVar4 = iVar4 + in_stack_00000020;
    }
  }
  else if (in_stack_0000002c == 2) {
    local_60 = -3.4028235e+38;
    for (; in_stack_00000008 < in_stack_0000000c; in_stack_00000008 = in_stack_00000008 + 1) {
      for (iVar4 = in_stack_00000020 * in_stack_00000008 + in_stack_00000010;
          iVar4 < in_stack_00000014 + in_stack_00000020 * in_stack_00000008; iVar4 = iVar4 + 1) {
        fVar6 = (float)(*in_stack_00000038)(in_stack_00000030,in_stack_00000050 + iVar4);
        if (fVar6 <= local_60) {
          fVar6 = local_60;
        }
        local_60 = fVar6;
      }
    }
  }
  else {
    local_60 = -3.4028235e+38;
  }
  return local_60;
}

Assistant:

float calc_max_generic(pooling_calc_context_t calc) {
  float max_val = -FLT_MAX;
  if (calc.kernel_size == 2) {
    for (int ix = calc.hstart; ix < calc.hend; ix++) {
      for (int jx = ix * calc.hstride + calc.wstart;
           jx < ix * calc.hstride + calc.wend; jx++) {
        float val = calc.get_x(calc.x, jx + calc.offset_x);
        if (max_val < val) {
          max_val = val;
        }
      }
    }
  } else if (calc.kernel_size == 3) {
    for (int ix = calc.hstart; ix < calc.hend; ix++) {
      for (int jx = calc.wstart; jx < calc.wend; jx++) {
        for (int kx = calc.dstart; kx < calc.dend; kx++) {
          float val = calc.get_x(calc.x, ix * calc.hstride + jx * calc.wstride +
                                             kx + calc.offset_x);
          if (max_val < val) {
            max_val = val;
          }
        }
      }
    }
  }
  return max_val;
}